

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O1

bool slang::parsing::Preprocessor::isSameMacro
               (DefineDirectiveSyntax *left,DefineDirectiveSyntax *right)

{
  MacroFormalArgumentListSyntax *pMVar1;
  MacroFormalArgumentListSyntax *pMVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar4;
  SyntaxNode *pSVar5;
  Token right_00;
  Token left_00;
  bool bVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar7;
  Info *unaff_RBX;
  ulong uVar8;
  long lVar9;
  undefined8 in_stack_ffffffffffffffb8;
  
  pMVar1 = left->formalArguments;
  pMVar2 = right->formalArguments;
  if ((pMVar1 != (MacroFormalArgumentListSyntax *)0x0) ==
      (pMVar2 == (MacroFormalArgumentListSyntax *)0x0)) {
    return false;
  }
  if (pMVar1 != (MacroFormalArgumentListSyntax *)0x0) {
    if (1 < ((pMVar2->args).elements._M_extent._M_extent_value + 1 ^
            (pMVar1->args).elements._M_extent._M_extent_value + 1)) {
      return false;
    }
    if (1 < (pMVar1->args).elements._M_extent._M_extent_value + 1) {
      lVar9 = 0;
      uVar8 = 0;
      do {
        ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&(((pMVar1->args).elements._M_ptr)->super_ConstTokenOrSyntax).
                                     super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                             + lVar9));
        pSVar3 = *ppSVar7;
        ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&(((pMVar2->args).elements._M_ptr)->super_ConstTokenOrSyntax).
                                     super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                             + lVar9));
        pSVar4 = *ppSVar7;
        left_00.info = unaff_RBX;
        left_00._0_8_ = right;
        right_00.info = (Info *)left;
        right_00.kind = (short)in_stack_ffffffffffffffb8;
        right_00._2_1_ = (char)((ulong)in_stack_ffffffffffffffb8 >> 0x10);
        right_00.numFlags.raw = (char)((ulong)in_stack_ffffffffffffffb8 >> 0x18);
        right_00.rawLen = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
        bVar6 = isSameToken(left_00,right_00);
        if (!bVar6) {
          return false;
        }
        pSVar5 = pSVar3[1].previewNode;
        if ((pSVar5 != (SyntaxNode *)0x0) == (pSVar4[1].previewNode == (SyntaxNode *)0x0)) {
          return false;
        }
        if ((pSVar5 != (SyntaxNode *)0x0) &&
           (bVar6 = isSameTokenList((TokenList *)&pSVar5[1].previewNode,
                                    (TokenList *)&pSVar4[1].previewNode[1].previewNode), !bVar6)) {
          return false;
        }
        uVar8 = uVar8 + 1;
        lVar9 = lVar9 + 0x30;
      } while (uVar8 != (pMVar1->args).elements._M_extent._M_extent_value + 1 >> 1);
    }
  }
  bVar6 = isSameTokenList(&left->body,&right->body);
  return bVar6;
}

Assistant:

bool Preprocessor::isSameMacro(const DefineDirectiveSyntax& left,
                               const DefineDirectiveSyntax& right) {
    // Names are assumed to match already.
    if (bool(left.formalArguments) != bool(right.formalArguments))
        return false;

    if (left.formalArguments) {
        auto& la = left.formalArguments->args;
        auto& ra = right.formalArguments->args;
        if (la.size() != ra.size())
            return false;

        for (auto laIt = la.begin(), raIt = ra.begin(); laIt != la.end(); laIt++, raIt++) {
            auto leftArg = *laIt;
            auto rightArg = *raIt;
            if (!isSameToken(leftArg->name, rightArg->name))
                return false;

            if (bool(leftArg->defaultValue) != bool(rightArg->defaultValue))
                return false;

            if (leftArg->defaultValue) {
                if (!isSameTokenList(leftArg->defaultValue->tokens, rightArg->defaultValue->tokens))
                    return false;
            }
        }
    }

    return isSameTokenList(left.body, right.body);
}